

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhexview.cpp
# Opt level: O0

int __thiscall QHexView::visibleLines(QHexView *this,bool absolute)

{
  bool bVar1;
  int iVar2;
  QWidget *this_00;
  quint64 qVar3;
  int *piVar4;
  qreal qVar5;
  int local_34;
  int local_1c;
  int local_18;
  byte local_11;
  int vl;
  bool absolute_local;
  QHexView *this_local;
  
  local_11 = absolute;
  _vl = this;
  this_00 = (QWidget *)QAbstractScrollArea::viewport();
  iVar2 = QWidget::height(this_00);
  qVar5 = lineHeight(this);
  local_18 = qCeil<double>((double)iVar2 / qVar5);
  bVar1 = QHexOptions::hasFlag(&this->m_options,0x20);
  if (!bVar1) {
    local_18 = local_18 + -1;
  }
  if ((local_11 & 1) == 0) {
    qVar3 = lines(this);
    local_1c = (int)qVar3;
    piVar4 = qMin<int>(&local_1c,&local_18);
    local_34 = *piVar4;
  }
  else {
    local_34 = local_18;
  }
  return local_34;
}

Assistant:

int QHexView::visibleLines(bool absolute) const {
    int vl = static_cast<int>(
        qCeil(this->viewport()->height() / this->lineHeight()));
    if(!m_options.hasFlag(QHexFlags::NoHeader))
        vl--;
    return absolute ? vl : qMin<int>(this->lines(), vl);
}